

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

_Bool mqttmessage_getIsDuplicateMsg(MQTT_MESSAGE_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  _Bool result;
  MQTT_MESSAGE_HANDLE handle_local;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                ,"mqttmessage_getIsDuplicateMsg",0x11e,1,"Invalid Parameter handle: %p.",0);
    }
    l._7_1_ = false;
  }
  else {
    l._7_1_ = (_Bool)(handle->isDuplicateMsg & 1);
  }
  return l._7_1_;
}

Assistant:

bool mqttmessage_getIsDuplicateMsg(MQTT_MESSAGE_HANDLE handle)
{
    bool result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_016: [If handle is NULL then mqttmessage_getIsDuplicateMsg shall return false.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = false;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_017: [mqttmessage_getIsDuplicateMsg shall return the isDuplicateMsg value contained in MQTT_MESSAGE_HANDLE handle.] */
        result = handle->isDuplicateMsg;
    }
    return result;
}